

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.h
# Opt level: O1

bool __thiscall DIntermissionController::Responder(DIntermissionController *this,event_t *ev)

{
  DIntermissionScreen *pDVar1;
  int iVar2;
  char *__s1;
  
  pDVar1 = (this->mScreen).field_0.p;
  if (pDVar1 == (DIntermissionScreen *)0x0) {
    return false;
  }
  if (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0) {
    if ((((this->mScreen).field_0.p)->mPaletteChanged == false) && (ev->type == '\x01')) {
      if ((ulong)(ushort)ev->data1 < 0x1c4) {
        __s1 = Bindings.Binds[(ushort)ev->data1].Chars;
      }
      else {
        __s1 = (char *)0x0;
      }
      if (__s1 != (char *)0x0) {
        iVar2 = strcasecmp(__s1,"toggleconsole");
        if (iVar2 == 0) {
          return false;
        }
        iVar2 = strcasecmp(__s1,"screenshot");
        if (iVar2 == 0) {
          return false;
        }
      }
    }
    if (1 < ((this->mScreen).field_0.p)->mTicker) {
      pDVar1 = (this->mScreen).field_0.p;
      iVar2 = (*(pDVar1->super_DObject)._vptr_DObject[8])(pDVar1,ev);
      if ((iVar2 == -1) && (this->mSentAdvance == false)) {
        Net_WriteByte('@');
        this->mSentAdvance = true;
      }
      return iVar2 != 0;
    }
  }
  else {
    (this->mScreen).field_0.p = (DIntermissionScreen *)0x0;
  }
  return false;
}

Assistant:

inline T *ReadBarrier(T *&obj)
	{
		if (obj == NULL || !(obj->ObjectFlags & OF_EuthanizeMe))
		{
			return obj;
		}
		return obj = NULL;
	}